

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O3

int hdr_log_encode(hdr_histogram *histogram,char **encoded_histogram)

{
  size_t input_len;
  int iVar1;
  size_t output_len;
  char *output;
  uint8_t *__ptr;
  uint8_t *compressed_histogram;
  size_t compressed_len;
  uint8_t *local_40;
  size_t local_38;
  
  local_40 = (uint8_t *)0x0;
  local_38 = 0;
  iVar1 = hdr_encode_compressed(histogram,&local_40,&local_38);
  input_len = local_38;
  __ptr = local_40;
  if (iVar1 == 0) {
    output_len = hdr_base64_encoded_len(local_38);
    output = (char *)calloc(output_len + 1,1);
    __ptr = local_40;
    iVar1 = hdr_base64_encode(local_40,input_len,output,output_len);
    if (iVar1 == 0) {
      *encoded_histogram = output;
      iVar1 = 0;
    }
    else {
      free(output);
    }
  }
  free(__ptr);
  return iVar1;
}

Assistant:

int hdr_log_encode(struct hdr_histogram* histogram, char** encoded_histogram)
{
    char *encoded_histogram_tmp = NULL;
    uint8_t* compressed_histogram = NULL;
    size_t compressed_len = 0;
    int rc = 0;
    int result = 0;
    size_t encoded_len;

    rc = hdr_encode_compressed(histogram, &compressed_histogram, &compressed_len);
    if (rc != 0)
    {
        FAIL_AND_CLEANUP(cleanup, result, rc);
    }

    encoded_len = hdr_base64_encoded_len(compressed_len);
    encoded_histogram_tmp = (char*) hdr_calloc(encoded_len + 1, sizeof(char));

    rc = hdr_base64_encode(
        compressed_histogram, compressed_len, encoded_histogram_tmp, encoded_len);
    if (rc != 0)
    {
        hdr_free(encoded_histogram_tmp);
        FAIL_AND_CLEANUP(cleanup, result, rc);
    }

    *encoded_histogram = encoded_histogram_tmp;

cleanup:
    hdr_free(compressed_histogram);

    return result;
}